

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-ir-builder.cpp
# Opt level: O0

Result<wasm::Ok> * __thiscall
wasm::IRBuilder::makeArrayNewFixed
          (Result<wasm::Ok> *__return_storage_ptr__,IRBuilder *this,HeapType type,uint32_t arity)

{
  ArrayNewFixed *expr;
  bool bVar1;
  Ok local_d9;
  uintptr_t local_d8;
  uint local_cc;
  Err local_c8;
  Err *local_98;
  Err *err;
  Result<wasm::Ok> _val;
  Type local_60;
  undefined1 local_58 [8];
  ArrayNewFixed curr;
  uint32_t arity_local;
  IRBuilder *this_local;
  HeapType type_local;
  
  curr.values.allocator._4_4_ = arity;
  ArrayNewFixed::ArrayNewFixed((ArrayNewFixed *)local_58,&this->wasm->allocator);
  _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.super__Move_assign_alias<wasm::Ok,_wasm::Err>.
  super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
  super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.super__Variant_storage_alias<wasm::Ok,_wasm::Err>.
  _32_8_ = type.id;
  wasm::Type::Type(&local_60,type,NonNullable,Inexact);
  curr.super_SpecificExpression<(wasm::Expression::Id)73>.super_Expression._0_8_ = local_60.id;
  ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::resize
            ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
             &curr.super_SpecificExpression<(wasm::Expression::Id)73>.super_Expression.type,
             (ulong)curr.values.allocator._4_4_);
  UnifiedExpressionVisitor<wasm::IRBuilder,_wasm::Result<wasm::Ok>_>::visitArrayNewFixed
            ((Result<wasm::Ok> *)&err,
             (UnifiedExpressionVisitor<wasm::IRBuilder,_wasm::Result<wasm::Ok>_> *)this,
             (ArrayNewFixed *)local_58);
  local_98 = Result<wasm::Ok>::getErr((Result<wasm::Ok> *)&err);
  bVar1 = local_98 != (Err *)0x0;
  if (bVar1) {
    wasm::Err::Err(&local_c8,local_98);
    Result<wasm::Ok>::Result(__return_storage_ptr__,&local_c8);
    wasm::Err::~Err(&local_c8);
  }
  local_cc = (uint)bVar1;
  Result<wasm::Ok>::~Result((Result<wasm::Ok> *)&err);
  if (local_cc == 0) {
    local_d8 = type.id;
    expr = Builder::makeArrayNewFixed<ArenaVector<wasm::Expression*>>
                     (&this->builder,type,
                      (ArenaVector<wasm::Expression_*> *)
                      &curr.super_SpecificExpression<(wasm::Expression::Id)73>.super_Expression.type
                     );
    push(this,(Expression *)expr);
    Result<wasm::Ok>::Result<wasm::Ok>(__return_storage_ptr__,&local_d9);
  }
  return __return_storage_ptr__;
}

Assistant:

Result<> IRBuilder::makeArrayNewFixed(HeapType type, uint32_t arity) {
  ArrayNewFixed curr(wasm.allocator);
  curr.type = Type(type, NonNullable);
  curr.values.resize(arity);
  CHECK_ERR(visitArrayNewFixed(&curr));
  push(builder.makeArrayNewFixed(type, curr.values));
  return Ok{};
}